

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

void pageant_conn_got_response(PageantClient *pc,PageantClientRequestId *reqid,ptrlen response)

{
  PageantClientInfo *ptr;
  strbuf *psVar1;
  bool bVar2;
  pageant_conn_queued_response *qr;
  pageant_conn_state *pcs;
  PageantClientRequestId *reqid_local;
  PageantClient *pc_local;
  ptrlen response_local;
  
  psVar1 = strbuf_new_nm();
  *(strbuf **)(reqid + -2) = psVar1;
  BinarySink_put_stringpl((BinarySink *)(*(long *)(reqid + -2) + 0x18),response);
  while( true ) {
    bVar2 = false;
    if (pc[-2].info != (PageantClientInfo *)&pc[-2].info) {
      bVar2 = pc[-2].info[1].pc != (PageantClient *)0x0;
    }
    if (!bVar2) break;
    ptr = pc[-2].info;
    sk_write((Socket *)pc[-0x2aaf].info,(ptr[1].pc)->info,*(size_t *)&(ptr[1].pc)->suppress_logging)
    ;
    ptr->pc->info = (PageantClientInfo *)(ptr->head).prev;
    ((ptr->head).prev)->prev = (PageantClientRequestNode *)ptr->pc;
    strbuf_free((strbuf *)ptr[1].pc);
    safefree(ptr);
  }
  return;
}

Assistant:

static void pageant_conn_got_response(
    PageantClient *pc, PageantClientRequestId *reqid, ptrlen response)
{
    struct pageant_conn_state *pcs =
        container_of(pc, struct pageant_conn_state, pc);
    struct pageant_conn_queued_response *qr =
        container_of(reqid, struct pageant_conn_queued_response, reqid);

    qr->sb = strbuf_new_nm();
    put_stringpl(qr->sb, response);

    while (pcs->response_queue.next != &pcs->response_queue &&
           pcs->response_queue.next->sb) {
        qr = pcs->response_queue.next;
        sk_write(pcs->connsock, qr->sb->u, qr->sb->len);
        qr->next->prev = qr->prev;
        qr->prev->next = qr->next;
        strbuf_free(qr->sb);
        sfree(qr);
    }
}